

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

void __thiscall
cfd::core::DescriptorKeyInfo::DescriptorKeyInfo(DescriptorKeyInfo *this,DescriptorKeyInfo *object)

{
  Privkey *in_stack_ffffffffffffff88;
  Privkey *this_00;
  DescriptorKeyInfo *object_local;
  DescriptorKeyInfo *this_local;
  
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  Pubkey::Pubkey(&this->pubkey_);
  Privkey::Privkey(&this->privkey_);
  ExtPrivkey::ExtPrivkey(&this->extprivkey_);
  ExtPubkey::ExtPubkey(&this->extpubkey_);
  this_00 = (Privkey *)&this->parent_info_;
  ::std::__cxx11::string::string((string *)this_00);
  ::std::__cxx11::string::string((string *)&this->path_);
  ::std::__cxx11::string::string((string *)&this->key_string_);
  this->key_type_ = object->key_type_;
  Pubkey::operator=(&this->pubkey_,&object->pubkey_);
  SchnorrPubkey::operator=(&this->schnorr_pubkey_,&object->schnorr_pubkey_);
  Privkey::operator=(this_00,in_stack_ffffffffffffff88);
  ExtPrivkey::operator=(&this->extprivkey_,&object->extprivkey_);
  ExtPubkey::operator=(&this->extpubkey_,&object->extpubkey_);
  ::std::__cxx11::string::operator=((string *)&this->parent_info_,(string *)&object->parent_info_);
  ::std::__cxx11::string::operator=((string *)&this->path_,(string *)&object->path_);
  ::std::__cxx11::string::operator=((string *)&this->key_string_,(string *)&object->key_string_);
  return;
}

Assistant:

DescriptorKeyInfo::DescriptorKeyInfo(const DescriptorKeyInfo& object) {
  key_type_ = object.key_type_;
  pubkey_ = object.pubkey_;
  schnorr_pubkey_ = object.schnorr_pubkey_;
  privkey_ = object.privkey_;
  extprivkey_ = object.extprivkey_;
  extpubkey_ = object.extpubkey_;
  parent_info_ = object.parent_info_;
  path_ = object.path_;
  key_string_ = object.key_string_;
}